

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQMDP.cpp
# Opt level: O1

Index __thiscall AgentQMDP::Act(AgentQMDP *this,Index joI)

{
  undefined1 auVar1 [16];
  Index IVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  Index joI_00;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  double local_58;
  double local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined1 extraout_var [56];
  
  if (this->_m_t != 0) {
    pDVar3 = ((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)->_m_DecPOMDP;
    JointBeliefSparse::Update
              (&this->_m_jb,
               (MultiAgentDecisionProcessDiscreteInterface *)
               ((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8)),this->_m_prevJaI,joI)
    ;
  }
  lVar5 = (**(code **)((long)*(((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.
                               _m_pu)->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  if (lVar5 == 0) {
    joI_00 = 0x7fffffff;
  }
  else {
    local_50 = -1.79769313486232e+308;
    uVar8 = 0x7fffffff;
    uVar9 = 0;
    do {
      sVar6 = PlanningUnitMADPDiscrete::GetNrStates
                        (&((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)
                          ->super_PlanningUnitMADPDiscrete);
      if (sVar6 == 0) {
        local_58 = 0.0;
      }
      else {
        local_58 = 0.0;
        uVar7 = 0;
        do {
          auVar11._0_8_ =
               BeliefSparse::Get((BeliefSparse *)
                                 (&(this->_m_jb).field_0x0 +
                                 *(long *)(*(long *)&this->_m_jb + -0xd8)),(Index)uVar7);
          auVar11._8_56_ = extraout_var;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_58;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (this->_m_Q).super_matrix_t.data_.data_
                         [uVar7 * (this->_m_Q).super_matrix_t.size2_ + uVar9];
          auVar1 = vfmadd231sd_fma(auVar12,auVar11._0_16_,auVar1);
          local_58 = auVar1._0_8_;
          uVar7 = (ulong)((Index)uVar7 + 1);
          sVar6 = PlanningUnitMADPDiscrete::GetNrStates
                            (&((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.
                              _m_pu)->super_PlanningUnitMADPDiscrete);
        } while (sVar6 != uVar7);
      }
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_50;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_58;
      auVar1 = vmaxsd_avx(auVar13,auVar10);
      if (local_50 < local_58) {
        uVar8 = uVar9 & 0xffffffff;
      }
      joI_00 = (Index)uVar8;
      uVar9 = uVar9 + 1;
      uVar7 = (**(code **)((long)*(((this->super_AgentSharedObservations).
                                    super_AgentDecPOMDPDiscrete._m_pu)->
                                  super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
      local_50 = auVar1._0_8_;
    } while (uVar9 != uVar7);
  }
  PlanningUnitMADPDiscrete::JointToIndividualActionIndices
            (&local_48,
             &((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)->
              super_PlanningUnitMADPDiscrete,joI_00);
  uVar4 = (*(this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
            _vptr_SimulationAgent[2])(this);
  IVar2 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4];
  this->_m_prevJaI = joI_00;
  this->_m_t = this->_m_t + 1;
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar2;
}

Assistant:

Index AgentQMDP::Act(Index joI)
{
    if(_m_t>0)
        _m_jb.Update(*GetPU()->GetDPOMDPD(),_m_prevJaI,joI);

    Index jaInew=INT_MAX,aI;
    double q,v=-DBL_MAX;
    for(size_t a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        q=0;
        for(unsigned s=0;s!=GetPU()->GetNrStates();++s)
            q+=_m_jb.Get(s)*_m_Q(s,a);

//        if(q>(v+PROB_PRECISION))
        if(q>v)
        {
            v=q;
            jaInew=a;
        }
    }

    vector<Index> aIs=GetPU()->JointToIndividualActionIndices(jaInew);
    aI=aIs[GetIndex()];

    _m_prevJaI=jaInew;
    _m_t++;

#if DEBUG_AgentQMDP
    cout << GetIndex() << ": ";
    _m_jb.Print();
    cout << " v " << v << " ja " << jaInew << " aI " << aI << endl;
#endif

    return(aI);
}